

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void * uv__reallocf(void *ptr,size_t size)

{
  void *pvVar1;
  void *newptr;
  size_t size_local;
  void *ptr_local;
  
  pvVar1 = uv__realloc(ptr,size);
  if ((pvVar1 == (void *)0x0) && (size != 0)) {
    uv__free(ptr);
  }
  return pvVar1;
}

Assistant:

void* uv__reallocf(void* ptr, size_t size) {
  void* newptr;

  newptr = uv__realloc(ptr, size);
  if (newptr == NULL)
    if (size > 0)
      uv__free(ptr);

  return newptr;
}